

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

void lha_replace_path_separator(lha *lha,archive_entry *entry)

{
  wchar_t *pwVar1;
  long in_RDI;
  size_t i;
  wchar_t *wp;
  archive_entry *in_stack_ffffffffffffffa8;
  archive_entry *in_stack_ffffffffffffffb0;
  archive_entry *entry_00;
  size_t in_stack_ffffffffffffffc0;
  wchar_t *in_stack_ffffffffffffffc8;
  archive_wstring *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  
  pwVar1 = archive_entry_pathname_w(in_stack_ffffffffffffffa8);
  if (pwVar1 != (wchar_t *)0x0) {
    *(undefined8 *)(in_RDI + 0x110) = 0;
    in_stack_ffffffffffffffd0 = (archive_wstring *)(in_RDI + 0x108);
    if (pwVar1 == (wchar_t *)0x0) {
      in_stack_ffffffffffffffc8 = (wchar_t *)0x0;
    }
    else {
      in_stack_ffffffffffffffc8 = (wchar_t *)wcslen(pwVar1);
    }
    archive_wstrncat(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    for (local_20 = 0; local_20 < *(ulong *)(in_RDI + 0x110); local_20 = local_20 + 1) {
      if (*(int *)(*(long *)(in_RDI + 0x108) + local_20 * 4) == 0x5c) {
        *(undefined4 *)(*(long *)(in_RDI + 0x108) + local_20 * 4) = 0x2f;
      }
    }
    archive_entry_copy_pathname_w(in_stack_ffffffffffffffb0,(wchar_t *)in_stack_ffffffffffffffa8);
  }
  pwVar1 = archive_entry_symlink_w(in_stack_ffffffffffffffa8);
  if (pwVar1 != (wchar_t *)0x0) {
    *(undefined8 *)(in_RDI + 0x110) = 0;
    if (pwVar1 == (wchar_t *)0x0) {
      entry_00 = (archive_entry *)0x0;
    }
    else {
      entry_00 = (archive_entry *)wcslen(pwVar1);
    }
    archive_wstrncat(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)pwVar1);
    for (local_20 = 0; local_20 < *(ulong *)(in_RDI + 0x110); local_20 = local_20 + 1) {
      if (*(int *)(*(long *)(in_RDI + 0x108) + local_20 * 4) == 0x5c) {
        *(undefined4 *)(*(long *)(in_RDI + 0x108) + local_20 * 4) = 0x2f;
      }
    }
    archive_entry_copy_symlink_w(entry_00,(wchar_t *)in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

static void
lha_replace_path_separator(struct lha *lha, struct archive_entry *entry)
{
	const wchar_t *wp;
	size_t i;

	if ((wp = archive_entry_pathname_w(entry)) != NULL) {
		archive_wstrcpy(&(lha->ws), wp);
		for (i = 0; i < archive_strlen(&(lha->ws)); i++) {
			if (lha->ws.s[i] == L'\\')
				lha->ws.s[i] = L'/';
		}
		archive_entry_copy_pathname_w(entry, lha->ws.s);
	}

	if ((wp = archive_entry_symlink_w(entry)) != NULL) {
		archive_wstrcpy(&(lha->ws), wp);
		for (i = 0; i < archive_strlen(&(lha->ws)); i++) {
			if (lha->ws.s[i] == L'\\')
				lha->ws.s[i] = L'/';
		}
		archive_entry_copy_symlink_w(entry, lha->ws.s);
	}
}